

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O2

int secp256k1_musig_pubnonce_load
              (secp256k1_context *ctx,secp256k1_ge *ges,secp256k1_musig_pubnonce *nonce)

{
  int iVar1;
  long lVar2;
  
  iVar1 = secp256k1_memcmp_var(nonce,secp256k1_musig_pubnonce_magic,4);
  if (iVar1 == 0) {
    iVar1 = 1;
    for (lVar2 = 0; lVar2 != 0x80; lVar2 = lVar2 + 0x40) {
      secp256k1_ge_from_bytes(ges,nonce->data + lVar2 + 4);
      ges = ges + 1;
    }
  }
  else {
    (*(ctx->illegal_callback).fn)
              ("secp256k1_memcmp_var(&nonce->data[0], secp256k1_musig_pubnonce_magic, 4) == 0",
               (ctx->illegal_callback).data);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int secp256k1_musig_pubnonce_load(const secp256k1_context* ctx, secp256k1_ge* ges, const secp256k1_musig_pubnonce* nonce) {
    int i;

    ARG_CHECK(secp256k1_memcmp_var(&nonce->data[0], secp256k1_musig_pubnonce_magic, 4) == 0);
    for (i = 0; i < 2; i++) {
        secp256k1_ge_from_bytes(&ges[i], nonce->data + 4 + 64*i);
    }
    return 1;
}